

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

void crnlib::rg_etc1::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint table_idx)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  component_t cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar5 = (ulong)table_idx;
  uVar4 = packed_color5 >> 7 & 0xf8 | packed_color5 >> 0xc & 7;
  uVar3 = packed_color5 >> 2 & 0xf8 | packed_color5 >> 7 & 7;
  iVar1 = (packed_color5 >> 2 & 7) + (packed_color5 & 0x1f) * 8;
  iVar8 = (&g_etc1_inten_tables)[uVar5 * 4];
  iVar9 = 0;
  iVar7 = iVar8 + uVar4;
  if ((int)(iVar8 + uVar4) < 1) {
    iVar7 = iVar9;
  }
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  iVar7 = iVar8 + uVar3;
  if ((int)(iVar8 + uVar3) < 1) {
    iVar7 = iVar9;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  iVar10 = (&DAT_001ae234)[uVar5 * 4];
  iVar2 = iVar8 + iVar1;
  if (iVar8 + iVar1 < 1) {
    iVar2 = iVar9;
  }
  (pDst->field_0).field_0.r = cVar6;
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  (pDst->field_0).field_0.g = (component_t)iVar7;
  (pDst->field_0).field_0.b = (component_t)iVar2;
  iVar8 = iVar10 + uVar4;
  if ((int)(iVar10 + uVar4) < 1) {
    iVar8 = iVar9;
  }
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar7 = iVar10 + uVar3;
  if ((int)(iVar10 + uVar3) < 1) {
    iVar7 = iVar9;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar8;
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar6;
  iVar8 = iVar10 + iVar1;
  if (iVar10 + iVar1 < 1) {
    iVar8 = iVar9;
  }
  cVar6 = (component_t)iVar8;
  if (0xfe < iVar8) {
    cVar6 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar6;
  pDst[1].field_0.field_0.a = 0xff;
  iVar8 = *(int *)(&DAT_001ae238 + uVar5 * 0x10);
  iVar7 = iVar8 + uVar4;
  if ((int)(iVar8 + uVar4) < 1) {
    iVar7 = iVar9;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  iVar10 = iVar8 + uVar3;
  if ((int)(iVar8 + uVar3) < 1) {
    iVar10 = iVar9;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar7;
  cVar6 = (component_t)iVar10;
  if (0xfe < iVar10) {
    cVar6 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar6;
  iVar7 = iVar8 + iVar1;
  if (iVar8 + iVar1 < 1) {
    iVar7 = iVar9;
  }
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar6;
  pDst[2].field_0.field_0.a = 0xff;
  iVar8 = *(int *)(&DAT_001ae23c + uVar5 * 0x10);
  iVar7 = uVar4 + iVar8;
  if ((int)(uVar4 + iVar8) < 1) {
    iVar7 = iVar9;
  }
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.r = cVar6;
  iVar7 = uVar3 + iVar8;
  if ((int)(uVar3 + iVar8) < 1) {
    iVar7 = iVar9;
  }
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.g = cVar6;
  iVar7 = iVar8 + iVar1;
  if (iVar8 + iVar1 < 1) {
    iVar7 = iVar9;
  }
  cVar6 = (component_t)iVar7;
  if (0xfe < iVar7) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.b = cVar6;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint table_idx)
        {
            RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
            const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

            uint r, g, b;
            unpack_color5(r, g, b, packed_color5, true);

            const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

            const int y0 = pInten_modifer_table[0];
            pDst[0].set(ir + y0, ig + y0, ib + y0);

            const int y1 = pInten_modifer_table[1];
            pDst[1].set(ir + y1, ig + y1, ib + y1);

            const int y2 = pInten_modifer_table[2];
            pDst[2].set(ir + y2, ig + y2, ib + y2);

            const int y3 = pInten_modifer_table[3];
            pDst[3].set(ir + y3, ig + y3, ib + y3);
        }